

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void setnodevector(lua_State *L,Table *t,uint size)

{
  int iVar1;
  Node *pNVar2;
  size_t sVar3;
  ulong uVar4;
  size_t nsize;
  
  if (size == 0) {
    t->node = &dummynode_;
    t->lsizenode = '\0';
    pNVar2 = (Node *)0x0;
  }
  else {
    iVar1 = luaO_ceillog2(size);
    if (0x1e < iVar1) {
      luaG_runerror(L,"table overflow");
    }
    uVar4 = (ulong)(uint)(1 << ((byte)iVar1 & 0x1f));
    nsize = uVar4 * 0x20;
    pNVar2 = (Node *)luaM_realloc_(L,(void *)0x0,0,nsize);
    t->node = pNVar2;
    for (sVar3 = 0; nsize != sVar3; sVar3 = sVar3 + 0x20) {
      pNVar2 = t->node;
      *(undefined8 *)((long)&pNVar2->i_key + sVar3 + 8) = 0;
      *(undefined4 *)((long)&(pNVar2->i_val).tt_ + sVar3) = 0;
    }
    t->lsizenode = (byte)iVar1;
    pNVar2 = t->node + uVar4;
  }
  t->lastfree = pNVar2;
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, unsigned int size) {
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common 'dummynode' */
    t->lsizenode = 0;
    t->lastfree = NULL;  /* signal that it is using dummy node */
  }
  else {
    int i;
    int lsize = luaO_ceillog2(size);
    if (lsize > MAXHBITS)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i = 0; i < (int)size; i++) {
      Node *n = gnode(t, i);
      gnext(n) = 0;
      setnilvalue(wgkey(n));
      setnilvalue(gval(n));
    }
    t->lsizenode = cast_byte(lsize);
    t->lastfree = gnode(t, size);  /* all positions are free */
  }
}